

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int wiz_show_stats(void)

{
  nh_menuitem *pnVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  monst *pmVar5;
  menulist menu;
  long total_obj_count;
  long total_obj_size;
  long size;
  long count;
  long total_mon_count;
  long total_mon_size;
  char buf [256];
  char buf_1 [256];
  menulist local_278;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248 [2];
  char local_238 [256];
  char local_138 [264];
  
  local_260 = 0;
  local_268 = 0;
  local_248[1] = 0;
  local_248[0] = 0;
  init_menulist(&local_278);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  builtin_strncpy(local_278.items[lVar2].caption,"Current memory s",0x10);
  builtin_strncpy(local_278.items[lVar2].caption + 0xb,"ory statistics:",0x10);
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  local_278.items[lVar2].caption[0] = '\0';
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.icount = local_278.icount + 1;
  sprintf(local_238,"Objects, size %d",0x68);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  pnVar1 = local_278.items + local_278.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  local_278.items[lVar2].caption[0] = '\0';
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  builtin_strncpy(local_278.items[lVar2].caption,"                ",0x10);
  builtin_strncpy(local_278.items[lVar2].caption + 0x10,"   count  bytes",0x10);
  local_278.icount = local_278.icount + 1;
  obj_chain(&local_278,"invent",invent,&local_268,&local_260);
  obj_chain(&local_278,"level->objlist",level->objlist,&local_268,&local_260);
  obj_chain(&local_278,"buried",level->buriedobjlist,&local_268,&local_260);
  obj_chain(&local_278,"magic chest obj",magic_chest_objs,&local_268,&local_260);
  mon_invent_chain(&local_278,"minvent",level->monlist,&local_268,&local_260);
  mon_invent_chain(&local_278,"migrating minvent",migrating_mons,&local_268,&local_260);
  local_250 = 0;
  local_258 = 0;
  count_obj(invent,&local_250,&local_258,'\0','\x01');
  count_obj(level->objlist,&local_250,&local_258,'\0','\x01');
  count_obj(level->buriedobjlist,&local_250,&local_258,'\0','\x01');
  count_obj(magic_chest_objs,&local_250,&local_258,'\0','\x01');
  pmVar5 = level->monlist;
  if (pmVar5 != (monst *)0x0) {
    do {
      count_obj(pmVar5->minvent,&local_250,&local_258,'\0','\x01');
      pmVar5 = pmVar5->nmon;
    } while (pmVar5 != (monst *)0x0);
  }
  if (migrating_mons != (monst *)0x0) {
    pmVar5 = migrating_mons;
    do {
      count_obj(pmVar5->minvent,&local_250,&local_258,'\0','\x01');
      pmVar5 = pmVar5->nmon;
    } while (pmVar5 != (monst *)0x0);
  }
  lVar3 = local_268 + local_250;
  lVar4 = local_260 + local_258;
  local_268 = lVar3;
  local_260 = lVar4;
  sprintf(local_138,"%-18s %4ld  %6ld","contained");
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  pnVar1 = local_278.items + local_278.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_138);
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  builtin_strncpy(local_278.items[lVar2].caption,"----------------",0x10);
  builtin_strncpy(local_278.items[lVar2].caption + 0x10,"-- -----  ------",0x10);
  local_278.items[lVar2].caption[0x20] = '\0';
  local_278.icount = local_278.icount + 1;
  sprintf(local_238,"%-18s %4ld  %6ld","Total",lVar3,lVar4);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  pnVar1 = local_278.items + local_278.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  local_278.items[lVar2].caption[0] = '\0';
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  local_278.items[lVar2].caption[0] = '\0';
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.icount = local_278.icount + 1;
  sprintf(local_238,"Monsters, size %d",0x78);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  pnVar1 = local_278.items + local_278.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_278.icount = local_278.icount + 1;
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  local_278.items[lVar2].caption[0] = '\0';
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.icount = local_278.icount + 1;
  mon_chain(&local_278,"level->monlist",level->monlist,local_248,local_248 + 1);
  mon_chain(&local_278,"migrating",migrating_mons,local_248,local_248 + 1);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  lVar2 = (long)local_278.icount;
  local_278.items[lVar2].id = 0;
  local_278.items[lVar2].role = MI_TEXT;
  local_278.items[lVar2].accel = '\0';
  local_278.items[lVar2].group_accel = '\0';
  local_278.items[lVar2].selected = '\0';
  builtin_strncpy(local_278.items[lVar2].caption,"----------------",0x10);
  builtin_strncpy(local_278.items[lVar2].caption + 0x10,"-- -----  ------",0x10);
  local_278.items[lVar2].caption[0x20] = '\0';
  local_278.icount = local_278.icount + 1;
  sprintf(local_238,"%-18s %4ld  %6ld","Total",local_248[0]);
  lVar2 = (long)local_278.size;
  if (local_278.size <= local_278.icount) {
    local_278.size = local_278.size * 2;
    local_278.items = (nh_menuitem *)realloc(local_278.items,lVar2 * 0x218);
  }
  pnVar1 = local_278.items + local_278.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_278.icount = local_278.icount + 1;
  display_menu(local_278.items,local_278.icount,(char *)0x0,0,(int *)0x0);
  free(local_278.items);
  return 0;
}

Assistant:

static int wiz_show_stats(void)
{
	char buf[BUFSZ];
	struct menulist menu;
	long total_obj_size = 0, total_obj_count = 0;
	long total_mon_size = 0, total_mon_count = 0;

	init_menulist(&menu);
	add_menutext(&menu, "Current memory statistics:");
	add_menutext(&menu, "");
	sprintf(buf, "Objects, size %d", (int) sizeof(struct obj));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");
	add_menutext(&menu, count_str);

	obj_chain(&menu, "invent", invent, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "level->objlist", level->objlist, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "buried", level->buriedobjlist,
				&total_obj_count, &total_obj_size);
	obj_chain(&menu, "magic chest obj", magic_chest_objs,
				&total_obj_count, &total_obj_size);
	mon_invent_chain(&menu, "minvent", level->monlist,
				&total_obj_count,&total_obj_size);
	mon_invent_chain(&menu, "migrating minvent", migrating_mons,
				&total_obj_count, &total_obj_size);

	contained(&menu, "contained",
				&total_obj_count, &total_obj_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_obj_count, total_obj_size);
	add_menutext(&menu, buf);

	add_menutext(&menu, "");
	add_menutext(&menu, "");
	sprintf(buf, "Monsters, size %d", (int) sizeof(struct monst));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");

	mon_chain(&menu, "level->monlist", level->monlist,
				&total_mon_count, &total_mon_size);
	mon_chain(&menu, "migrating", migrating_mons,
				&total_mon_count, &total_mon_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_mon_count, total_mon_size);
	add_menutext(&menu, buf);

	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}